

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

function<void_(UdpSocket_*)> * __thiscall
SslUdpSocket::BindFuncSslInitDone
          (function<void_(UdpSocket_*)> *__return_storage_ptr__,SslUdpSocket *this,
          function<void_(UdpSocket_*)> *fSllInitDone)

{
  BaseSocketImpl *pBVar1;
  SslUdpSocketImpl *this_00;
  _Any_data local_40;
  code *local_30;
  
  pBVar1 = (this->super_UdpSocket).super_BaseSocket.Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    this_00 = (SslUdpSocketImpl *)0x0;
  }
  else {
    this_00 = (SslUdpSocketImpl *)
              __dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&SslUdpSocketImpl::typeinfo,0);
  }
  std::function<void_(UdpSocket_*)>::function
            ((function<void_(UdpSocket_*)> *)&local_40,fSllInitDone);
  SslUdpSocketImpl::BindFuncSslInitDone
            (__return_storage_ptr__,this_00,(function<void_(UdpSocket_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<void(UdpSocket*)> SslUdpSocket::BindFuncSslInitDone(std::function<void(UdpSocket*)> fSllInitDone)
{
    return dynamic_cast<SslUdpSocketImpl*>(GetImpl())->BindFuncSslInitDone(fSllInitDone);
}